

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eclmap.c
# Opt level: O3

int control(state_t *state,int linenum,char *cline)

{
  int iVar1;
  seqmap_t *psVar2;
  
  iVar1 = strcmp(cline,"!ins_names");
  if (iVar1 == 0) {
    psVar2 = state->emap->ins_names;
LAB_0011622c:
    state->smap = psVar2;
    state->ident = 1;
  }
  else {
    iVar1 = strcmp(cline,"!ins_signatures");
    if (iVar1 == 0) {
      psVar2 = state->emap->ins_signatures;
    }
    else {
      iVar1 = strcmp(cline,"!gvar_names");
      if (iVar1 == 0) {
        psVar2 = state->emap->gvar_names;
        goto LAB_0011622c;
      }
      iVar1 = strcmp(cline,"!gvar_types");
      if (iVar1 == 0) {
        psVar2 = state->emap->gvar_types;
      }
      else {
        iVar1 = strcmp(cline,"!timeline_ins_names");
        if (iVar1 == 0) {
          psVar2 = state->emap->timeline_ins_names;
          goto LAB_0011622c;
        }
        iVar1 = strcmp(cline,"!timeline_ins_signatures");
        if (iVar1 != 0) {
          fprintf(_stderr,"%s:%s:%u: unknown control line \'%s\'\n",argv0,state->fn,linenum,cline);
          return 1;
        }
        psVar2 = state->emap->timeline_ins_signatures;
      }
    }
    state->smap = psVar2;
    state->ident = 0;
  }
  return 0;
}

Assistant:

static int
control(
    state_t *state,
    int linenum,
    const char *cline)
{
    if (!strcmp(cline, "!ins_names")) {
        state->smap = state->emap->ins_names;
        state->ident = 1;
    } else if (!strcmp(cline, "!ins_signatures")) {
        state->smap = state->emap->ins_signatures;
        state->ident = 0;
    } else if (!strcmp(cline, "!gvar_names")) {
        state->smap = state->emap->gvar_names;
        state->ident = 1;
    } else if (!strcmp(cline, "!gvar_types")) {
        state->smap = state->emap->gvar_types;
        state->ident = 0;
    } else if (!strcmp(cline, "!timeline_ins_names")) {
        state->smap = state->emap->timeline_ins_names;
        state->ident = 1;
    } else if (!strcmp(cline, "!timeline_ins_signatures")) {
        state->smap = state->emap->timeline_ins_signatures;
        state->ident = 0;
    } else {
        fprintf(stderr, "%s:%s:%u: unknown control line '%s'\n",argv0,state->fn,linenum,cline);
        return 1;
    }
    return 0;
}